

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O1

void memory_tree_ns::save_load_example
               (example *ec,io_buf *model_file,bool *read,bool *text,stringstream *msg,int *oas)

{
  stringstream *psVar1;
  uint64_t *data;
  polylabel *this;
  char *data_00;
  v_array<char> *this_00;
  byte bVar2;
  bool bVar3;
  ostream *poVar4;
  ulong uVar5;
  uchar *puVar6;
  features *this_01;
  uint uVar7;
  bool *pbVar8;
  float *pfVar9;
  unsigned_long *data_01;
  ulong uVar10;
  example *peVar11;
  stringstream *msg_00;
  size_t tag_number;
  size_t feat_size;
  size_t namespace_size;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  bool *local_58;
  example *local_50;
  stringstream *local_48;
  byte *local_40;
  byte *local_38;
  
  psVar1 = msg + 0x10;
  local_58 = text;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar1,"num_features",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar1," = ",3);
  local_50 = ec;
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)psVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  if (*read == true) {
    io_buf::bin_read_fixed(model_file,(char *)&ec->num_features,8,"");
  }
  else {
    bin_text_write_fixed(model_file,(char *)&ec->num_features,8,msg,*local_58);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar1,"total_sum_features",0x12);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar1," = ",3);
  peVar11 = local_50;
  pfVar9 = &local_50->total_sum_feat_sq;
  poVar4 = std::ostream::_M_insert<double>((double)local_50->total_sum_feat_sq);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  if (*read == true) {
    io_buf::bin_read_fixed(model_file,(char *)pfVar9,4,"");
  }
  else {
    bin_text_write_fixed(model_file,(char *)pfVar9,4,msg,*local_58);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar1,"example_weight",0xe);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar1," = ",3);
  poVar4 = std::ostream::_M_insert<double>((double)peVar11->weight);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  pbVar8 = local_58;
  if (*read == true) {
    io_buf::bin_read_fixed(model_file,(char *)&peVar11->weight,4,"");
    pbVar8 = local_58;
  }
  else {
    bin_text_write_fixed(model_file,(char *)&peVar11->weight,4,msg,*local_58);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar1,"loss",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar1," = ",3);
  poVar4 = std::ostream::_M_insert<double>((double)peVar11->loss);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  if (*read == true) {
    io_buf::bin_read_fixed(model_file,(char *)&peVar11->loss,4,"");
  }
  else {
    bin_text_write_fixed(model_file,(char *)&peVar11->loss,4,msg,*pbVar8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar1,"ft_offset",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar1," = ",3);
  data = &(peVar11->super_example_predict).ft_offset;
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)psVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  if (*read == true) {
    io_buf::bin_read_fixed(model_file,(char *)data,8,"");
  }
  else {
    bin_text_write_fixed(model_file,(char *)data,8,msg,*pbVar8);
  }
  local_48 = msg;
  if (*oas == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar1,"multiclass_label",0x10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar1," = ",3);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)psVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    if (*read == true) {
      io_buf::bin_read_fixed(model_file,&(peVar11->l).empty,4,"");
    }
    else {
      bin_text_write_fixed(model_file,&(peVar11->l).empty,4,msg,*pbVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar1,"multiclass_weight",0x11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar1," = ",3);
    data_00 = (char *)((long)&peVar11->l + 4);
    poVar4 = std::ostream::_M_insert<double>((double)(peVar11->l).simple.weight);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    if (*read == true) {
      io_buf::bin_read_fixed(model_file,data_00,4,"");
    }
    else {
      bin_text_write_fixed(model_file,data_00,4,msg,*pbVar8);
    }
  }
  else {
    local_70 = (long)(peVar11->l).cs.costs._end - (long)(peVar11->l).cs.costs._begin >> 2;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar1,"label_size",10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar1," = ",3);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)psVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    if (*read == true) {
      io_buf::bin_read_fixed(model_file,(char *)&local_70,8,"");
    }
    else {
      bin_text_write_fixed(model_file,(char *)&local_70,8,msg,*pbVar8);
    }
    this = &peVar11->l;
    if ((*read == true) &&
       (v_array<unsigned_int>::clear((v_array<unsigned_int> *)&this->simple), local_70 != 0)) {
      uVar5 = 1;
      do {
        local_60 = local_60 & 0xffffffff00000000;
        v_array<unsigned_int>::push_back((v_array<unsigned_int> *)&this->simple,(uint *)&local_60);
        bVar3 = uVar5 < local_70;
        uVar5 = (ulong)((int)uVar5 + 1);
      } while (bVar3);
    }
    msg = local_48;
    pbVar8 = local_58;
    peVar11 = local_50;
    if (local_70 != 0) {
      uVar7 = 1;
      uVar5 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar1,"ec_label",8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar1," = ",3);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)psVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        pfVar9 = &((this->cs).costs._begin)->x + uVar5;
        if (*read == true) {
          io_buf::bin_read_fixed(model_file,(char *)pfVar9,4,"");
        }
        else {
          bin_text_write_fixed(model_file,(char *)pfVar9,4,msg,*local_58);
        }
        uVar5 = (ulong)uVar7;
        uVar7 = uVar7 + 1;
        pbVar8 = local_58;
        peVar11 = local_50;
      } while (uVar5 < local_70);
    }
  }
  local_70 = (long)(peVar11->tag)._end - (long)(peVar11->tag)._begin;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar1,"tags",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar1," = ",3);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)psVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  if (*read == true) {
    io_buf::bin_read_fixed(model_file,(char *)&local_70,8,"");
  }
  else {
    bin_text_write_fixed(model_file,(char *)&local_70,8,msg,*pbVar8);
  }
  this_00 = &peVar11->tag;
  if ((*read == true) && (v_array<char>::clear(this_00), local_70 != 0)) {
    uVar5 = 1;
    do {
      local_60 = CONCAT71(local_60._1_7_,0x61);
      v_array<char>::push_back(this_00,(char *)&local_60);
      bVar3 = uVar5 < local_70;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar3);
  }
  msg_00 = local_48;
  if (local_70 != 0) {
    uVar5 = 0;
    uVar10 = 1;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar1,"tag",3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar1," = ",3);
      local_60 = CONCAT71(local_60._1_7_,this_00->_begin[uVar5]);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)psVar1,(char *)&local_60,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      if (*read == true) {
        io_buf::bin_read_fixed(model_file,this_00->_begin + uVar5,1,"");
      }
      else {
        bin_text_write_fixed(model_file,this_00->_begin + uVar5,1,msg_00,*local_58);
      }
      bVar3 = uVar10 < local_70;
      uVar5 = uVar10;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (bVar3);
  }
  peVar11 = local_50;
  local_60 = (long)(local_50->super_example_predict).indices._end -
             (long)(local_50->super_example_predict).indices._begin;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar1,"namespaces",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar1," = ",3);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)psVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  if (*read == true) {
    io_buf::bin_read_fixed(model_file,(char *)&local_60,8,"");
  }
  else {
    bin_text_write_fixed(model_file,(char *)&local_60,8,msg_00,*local_58);
  }
  if (*read != false) {
    puVar6 = (peVar11->super_example_predict).indices._begin;
    if (puVar6 != (uchar *)0x0) {
      free(puVar6);
    }
    (peVar11->super_example_predict).indices._begin = (uchar *)0x0;
    (peVar11->super_example_predict).indices._end = (uchar *)0x0;
    (peVar11->super_example_predict).indices.end_array = (uchar *)0x0;
    if (local_60 != 0) {
      uVar5 = 1;
      do {
        local_68 = local_68 & 0xffffffffffffff00;
        v_array<unsigned_char>::push_back((v_array<unsigned_char> *)peVar11,(uchar *)&local_68);
        bVar3 = uVar5 < local_60;
        uVar5 = (ulong)((int)uVar5 + 1);
      } while (bVar3);
    }
  }
  peVar11 = local_50;
  if (local_60 != 0) {
    uVar5 = 0;
    uVar10 = 1;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar1,"namespace_index",0xf);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar1," = ",3);
      local_68 = CONCAT71(local_68._1_7_,(peVar11->super_example_predict).indices._begin[uVar5]);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)psVar1,(char *)&local_68,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      puVar6 = (peVar11->super_example_predict).indices._begin + uVar5;
      if (*read == true) {
        io_buf::bin_read_fixed(model_file,(char *)puVar6,1,"");
      }
      else {
        bin_text_write_fixed(model_file,(char *)puVar6,1,msg_00,*local_58);
      }
      bVar3 = uVar10 < local_60;
      uVar5 = uVar10;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (bVar3);
  }
  local_38 = (local_50->super_example_predict).indices._begin;
  local_40 = (local_50->super_example_predict).indices._end;
  if (local_38 != local_40) {
    local_50 = (example *)(local_50->super_example_predict).feature_space;
    do {
      peVar11 = local_50;
      bVar2 = *local_38;
      local_68 = (long)(((features *)((long)local_50 + (ulong)bVar2 * 0x68))->values)._end -
                 (long)(((features *)((long)local_50 + (ulong)bVar2 * 0x68))->values)._begin >> 2;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar1,"features_",9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar1," = ",3);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)psVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      if (*read == true) {
        io_buf::bin_read_fixed(model_file,(char *)&local_68,8,"");
      }
      else {
        bin_text_write_fixed(model_file,(char *)&local_68,8,msg_00,*local_58);
      }
      this_01 = (features *)((long)peVar11 + (ulong)bVar2 * 0x68);
      if (*read == true) {
        features::clear(this_01);
        (this_01->values).end_array = (float *)0x0;
        (this_01->values).erase_count = 0;
        (this_01->values)._begin = (float *)0x0;
        (this_01->values)._end = (float *)0x0;
        (this_01->indicies)._begin = (unsigned_long *)0x0;
        (this_01->indicies)._end = (unsigned_long *)0x0;
        (this_01->indicies).end_array = (unsigned_long *)0x0;
        (this_01->indicies).erase_count = 0;
        if (local_68 != 0) {
          uVar5 = 1;
          do {
            features::push_back(this_01,0.0,0);
            bVar3 = uVar5 < local_68;
            uVar5 = (ulong)((int)uVar5 + 1);
          } while (bVar3);
        }
      }
      if (local_68 != 0) {
        uVar5 = 0;
        uVar10 = 1;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar1,"value",5);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar1," = ",3);
          poVar4 = std::ostream::_M_insert<double>((double)(this_01->values)._begin[uVar5]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          pfVar9 = (this_01->values)._begin + uVar5;
          if (*read == true) {
            io_buf::bin_read_fixed(model_file,(char *)pfVar9,4,"");
          }
          else {
            bin_text_write_fixed(model_file,(char *)pfVar9,4,local_48,*local_58);
          }
          bVar3 = uVar10 < local_68;
          uVar5 = uVar10;
          uVar10 = (ulong)((int)uVar10 + 1);
        } while (bVar3);
      }
      if (local_68 != 0) {
        uVar5 = 0;
        uVar10 = 1;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar1,"index",5);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar1," = ",3);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)psVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          data_01 = (this_01->indicies)._begin + uVar5;
          if (*read == true) {
            io_buf::bin_read_fixed(model_file,(char *)data_01,8,"");
          }
          else {
            bin_text_write_fixed(model_file,(char *)data_01,8,local_48,*local_58);
          }
          bVar3 = uVar10 < local_68;
          uVar5 = uVar10;
          uVar10 = (ulong)((int)uVar10 + 1);
        } while (bVar3);
      }
      local_38 = local_38 + 1;
      msg_00 = local_48;
    } while (local_38 != local_40);
  }
  return;
}

Assistant:

void save_load_example(example* ec, io_buf& model_file, bool& read, bool& text, stringstream& msg, int& oas)
    {   //deal with tag
        //deal with labels:
	    writeit(ec->num_features, "num_features");
	    writeit(ec->total_sum_feat_sq, "total_sum_features");
	    writeit(ec->weight, "example_weight");
	    writeit(ec->loss, "loss");
	    writeit(ec->ft_offset, "ft_offset");
        if(oas == false){ //multi-class
            writeit(ec->l.multi.label, "multiclass_label");
            writeit(ec->l.multi.weight, "multiclass_weight");
        }
        else{ //multi-label
            writeitvar(ec->l.multilabels.label_v.size(), "label_size", label_size);
            if (read){
            	ec->l.multilabels.label_v.clear();
            	for (uint32_t i = 0; i < label_size; i++)
                	ec->l.multilabels.label_v.push_back(0);
            }
            for (uint32_t i = 0; i < label_size; i++)
                writeit(ec->l.multilabels.label_v[i], "ec_label");
        }

        writeitvar(ec->tag.size(), "tags", tag_number);
        if (read){
            ec->tag.clear();
            for (uint32_t i = 0; i < tag_number; i++)
                ec->tag.push_back('a');
        }
        for (uint32_t i = 0; i < tag_number; i++)
            writeit(ec->tag[i], "tag");
        
        //deal with tag:
        writeitvar(ec->indices.size(), "namespaces", namespace_size);
        if (read){
            ec->indices.delete_v();
            for (uint32_t i = 0; i< namespace_size; i++){
                ec->indices.push_back('\0');
            }
        }
        for(uint32_t i = 0; i < namespace_size; i++)
            writeit(ec->indices[i], "namespace_index");

        //deal with features
        for (namespace_index nc: ec->indices){
            features* fs = &ec->feature_space[nc];
            writeitvar(fs->size(), "features_", feat_size);
            if (read){
                fs->clear();
                fs->values = v_init<feature_value>();
                fs->indicies = v_init<feature_index>();
                for (uint32_t f_i = 0; f_i < feat_size; f_i++){
                    fs->push_back(0, 0);
                }
            }
            for (uint32_t f_i = 0; f_i < feat_size; f_i++)
                writeit(fs->values[f_i], "value");
            for (uint32_t f_i = 0; f_i < feat_size; f_i++)
                writeit(fs->indicies[f_i], "index");
        }
    }